

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O2

void Hop_ManPrintVerbose(Hop_Man_t *p,int fHaig)

{
  void *pvVar1;
  Vec_Ptr_t *p_00;
  Hop_Obj_t *pObj;
  int iVar2;
  int fHaig_00;
  undefined4 in_register_00000034;
  
  printf("PIs: ",CONCAT44(in_register_00000034,fHaig));
  for (iVar2 = 0; iVar2 < p->vPis->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(p->vPis,iVar2);
    printf(" %p",pvVar1);
  }
  putchar(10);
  p_00 = Hop_ManDfs(p);
  for (iVar2 = 0; iVar2 < p_00->nSize; iVar2 = iVar2 + 1) {
    fHaig_00 = iVar2;
    pObj = (Hop_Obj_t *)Vec_PtrEntry(p_00,iVar2);
    Hop_ObjPrintVerbose(pObj,fHaig_00);
    putchar(10);
  }
  putchar(10);
  Vec_PtrFree(p_00);
  return;
}

Assistant:

void Hop_ManPrintVerbose( Hop_Man_t * p, int fHaig )
{
    Vec_Ptr_t * vNodes;
    Hop_Obj_t * pObj;
    int i;
    printf( "PIs: " );
    Hop_ManForEachPi( p, pObj, i )
        printf( " %p", pObj );
    printf( "\n" );
    vNodes = Hop_ManDfs( p );
    Vec_PtrForEachEntry( Hop_Obj_t *, vNodes, pObj, i )
        Hop_ObjPrintVerbose( pObj, fHaig ), printf( "\n" );
    printf( "\n" );
    Vec_PtrFree( vNodes );
}